

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[10],Diligent::MAP_TYPE,char[63],Diligent::MAP_TYPE>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [10],MAP_TYPE *RestArgs,char (*RestArgs_1) [63],MAP_TYPE *RestArgs_2
               )

{
  undefined8 in_RAX;
  size_t sVar1;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  uStack_38 = CONCAT17(*RestArgs,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(ss + 0x10),(char *)((long)&uStack_38 + 7),1);
  FormatStrSS<std::__cxx11::stringstream,char[63],Diligent::MAP_TYPE>(ss,RestArgs_1,RestArgs_2);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}